

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  DescriptorBuilder *this_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *this_01;
  string *relative_to;
  MessageOptions *this_02;
  FieldDescriptor *this_03;
  Descriptor *pDVar4;
  Symbol SVar5;
  FieldDescriptor *extension;
  int i;
  Descriptor *foreign_type;
  Symbol result;
  Descriptor *descriptor;
  string *name_local;
  Message *message_local;
  AggregateOptionFinder *this_local;
  
  assert_mutex_held(this->builder_->pool_);
  this_01 = Message::GetDescriptor(message);
  this_00 = this->builder_;
  relative_to = Descriptor::full_name_abi_cxx11_(this_01);
  SVar5 = LookupSymbolNoPlaceholder(this_00,name,relative_to,LOOKUP_ALL);
  this_local = (AggregateOptionFinder *)SVar5.field_1;
  if ((SVar5.type != FIELD) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)this_local), !bVar1)) {
    if (SVar5.type == MESSAGE) {
      this_02 = Descriptor::options(this_01);
      bVar1 = MessageOptions::message_set_wire_format(this_02);
      if (bVar1) {
        for (extension._4_4_ = 0; iVar2 = Descriptor::extension_count((Descriptor *)this_local),
            extension._4_4_ < iVar2; extension._4_4_ = extension._4_4_ + 1) {
          this_03 = Descriptor::extension((Descriptor *)this_local,extension._4_4_);
          pDVar4 = FieldDescriptor::containing_type(this_03);
          if ((((pDVar4 == this_01) &&
               (TVar3 = FieldDescriptor::type(this_03), TVar3 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional(this_03), bVar1)) &&
             (pDVar4 = FieldDescriptor::message_type(this_03),
             (AggregateOptionFinder *)pDVar4 == this_local)) {
            return this_03;
          }
        }
      }
    }
    this_local = (AggregateOptionFinder *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }